

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void __thiscall
phosg::PrefixedLogger::PrefixedLogger(PrefixedLogger *this,string *prefix,LogLevel min_level)

{
  LogLevel min_level_local;
  string *prefix_local;
  PrefixedLogger *this_local;
  
  ::std::__cxx11::string::string((string *)this,prefix);
  this->min_level = min_level;
  return;
}

Assistant:

PrefixedLogger::PrefixedLogger(const string& prefix, LogLevel min_level)
    : prefix(prefix),
      min_level(min_level) {}